

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O3

void __thiscall
TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test::testBody
          (TEST_CommandLineTestRunner_veryVerboseSetOnOutput_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [2];
  CommandLineTestRunner local_50;
  undefined8 local_30;
  long lStack_28;
  undefined8 local_20;
  char *local_18;
  char *pcStack_10;
  
  local_18 = "tests.exe";
  pcStack_10 = "-vv";
  CommandLineTestRunner::CommandLineTestRunner
            (&local_50,2,&local_18,
             &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  local_50._vptr_CommandLineTestRunner = (_func_int **)&PTR__CommandLineTestRunner_00348440;
  local_30 = 0;
  lStack_28 = 0;
  local_20 = 0;
  CommandLineTestRunner::runAllTestsMain(&local_50);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)(lStack_28 + 0x20));
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"TEST(group1, test1)",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xdb);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)(lStack_28 + 0x20));
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"destroyTest",pcVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xdc);
  CommandLineTestRunner::~CommandLineTestRunner(&local_50);
  return;
}

Assistant:

TEST(CommandLineTestRunner, veryVerboseSetOnOutput)
{
    const char* argv[] = { "tests.exe", "-vv"};

    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(2, argv, &registry);
    commandLineTestRunner.runAllTestsMain();
    STRCMP_CONTAINS("TEST(group1, test1)", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
    STRCMP_CONTAINS("destroyTest", commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().asCharString());
}